

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Renderer.cpp
# Opt level: O1

void __thiscall Renderer::drawSegment(Renderer *this,Vector3 *u,Vector3 *v,Mat *img,Scalar *color)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double *pdVar4;
  Camera *this_00;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  double dis;
  Vector3 vec;
  Vector3 pos;
  Ray seg;
  undefined8 local_110;
  undefined1 local_108 [16];
  double local_f8;
  double dStack_f0;
  undefined4 local_e0 [2];
  Mat *local_d8;
  undefined8 uStack_d0;
  double local_c8;
  undefined8 uStack_c0;
  undefined1 local_b8 [16];
  Vector3 local_a8;
  Vector3 local_90;
  Vector3 local_78;
  Ray local_60;
  
  operator-(v,u);
  Ray::Ray(&local_60,u,(Vector3 *)local_108);
  operator-(v,u);
  dVar1 = Vector3::len((Vector3 *)local_108);
  dis = 0.0;
  if (0.0 <= dVar1) {
    dVar2 = dVar1 / 50.0;
    if (dVar2 <= 0.01) {
      dVar2 = 0.01;
    }
    this_00 = &(this->world).camera;
    do {
      Ray::travel(&local_90,&local_60,dis);
      local_a8.x = local_90.x;
      local_a8.y = local_90.y;
      local_a8.z = local_90.z;
      Camera::getPixelPos(&local_78,this_00,&local_a8);
      operator-(&this_00->O,&local_90);
      dVar3 = World::getRadianceWithLight(&this->world,&local_90,(Vector3 *)local_108,&this_00->O);
      local_b8._8_4_ = extraout_XMM0_Dc;
      local_b8._0_8_ = dVar3 * 0.9 + 0.1;
      local_b8._12_4_ = extraout_XMM0_Dd;
      uStack_d0 = 0;
      local_e0[0] = 0x3010000;
      local_d8 = img;
      pdVar4 = Vector3::operator[](&local_78,0);
      local_c8 = *pdVar4;
      uStack_c0 = 0;
      pdVar4 = Vector3::operator[](&local_78,1);
      local_110 = CONCAT44((int)*pdVar4,(int)local_c8);
      local_108._8_4_ =
           SUB84(_color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[1] *
                 (double)local_b8._0_8_,0);
      local_108._0_8_ =
           _color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0] * (double)local_b8._0_8_;
      local_108._12_4_ =
           (int)((ulong)(_color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[1] *
                        (double)local_b8._0_8_) >> 0x20);
      local_f8 = (double)local_b8._0_8_ *
                 _color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[2];
      dStack_f0 = (double)local_b8._0_8_ *
                  _color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3];
      cv::circle(local_e0,&local_110,2,(Vector3 *)local_108,0xffffffff,8,0);
      dis = dis + dVar2;
    } while (dis <= dVar1);
  }
  return;
}

Assistant:

void Renderer::drawSegment(Vector3 u, Vector3 v, Mat &img, Scalar color)
{
    Ray seg(u, v - u);
    //cout << u << '\t' << v << endl;
    double len = (v - u).len(), intvl = max(0.01, len / 50);
    for (double t = 0; t <= len; t += intvl) {
        Vector3 vec(seg.travel(t));
        Vector3 pos = world.camera.getPixelPos(vec);
        double tmp = (0.1 + 0.9*world.getRadianceWithLight(vec, world.camera.O - vec, world.camera.O));// + 0.7/(world.camera.O - vec).len()*3);
        cv::circle(img, cv::Point(pos[0], pos[1]), 2, _color* tmp/* + (1-tmp)*Scalar(res.at<Vec3b>(min(max(0, (int)pos[1]), H), min(max(0, (int)pos[0]), H)))*/, -1);
    }
}